

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O2

bool CheckTxScriptsSanity(CMutableTransaction *tx)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  pointer pCVar4;
  pointer pCVar5;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  CTransaction local_b0;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  CTransaction::CTransaction(&local_b0,tx);
  bVar1 = CTransaction::IsCoinBase(&local_b0);
  CTransaction::~CTransaction(&local_b0);
  if (bVar1) {
LAB_002c76e6:
    pCVar4 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      uVar7 = (ulong)uVar6;
      uVar3 = ((long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar4) / 0x28;
      bVar1 = uVar3 <= uVar7;
      if (uVar3 <= uVar7) break;
      bVar2 = CScript::HasValidOps(&pCVar4[uVar7].scriptPubKey);
      if (!bVar2) break;
      pCVar4 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = uVar6 + 1;
    } while (pCVar4[uVar7].scriptPubKey.super_CScriptBase._size < 0x272e);
  }
  else {
    pCVar5 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      uVar3 = (ulong)uVar6;
      if ((ulong)(((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pCVar5) / 0x68) <= uVar3)
      goto LAB_002c76e6;
      bVar1 = CScript::HasValidOps(&pCVar5[uVar3].scriptSig);
      if (!bVar1) break;
      pCVar5 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = uVar6 + 1;
    } while (*(size_type *)((long)&pCVar5[uVar3].scriptSig.super_CScriptBase + 0x1c) < 0x272e);
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

static bool CheckTxScriptsSanity(const CMutableTransaction& tx)
{
    // Check input scripts for non-coinbase txs
    if (!CTransaction(tx).IsCoinBase()) {
        for (unsigned int i = 0; i < tx.vin.size(); i++) {
            if (!tx.vin[i].scriptSig.HasValidOps() || tx.vin[i].scriptSig.size() > MAX_SCRIPT_SIZE) {
                return false;
            }
        }
    }
    // Check output scripts
    for (unsigned int i = 0; i < tx.vout.size(); i++) {
        if (!tx.vout[i].scriptPubKey.HasValidOps() || tx.vout[i].scriptPubKey.size() > MAX_SCRIPT_SIZE) {
            return false;
        }
    }

    return true;
}